

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Block::GetTxOutProof(ByteData *__return_storage_ptr__,Block *this,Txid *txid)

{
  initializer_list<cfd::core::Txid> __l;
  Txid *local_a8;
  allocator<cfd::core::Txid> local_7d [13];
  Txid *local_70;
  Txid local_68;
  undefined1 local_48 [40];
  Txid *local_20;
  Txid *txid_local;
  Block *this_local;
  
  local_70 = &local_68;
  local_20 = txid;
  txid_local = (Txid *)this;
  this_local = (Block *)__return_storage_ptr__;
  Txid::Txid(local_70,txid);
  local_48._0_8_ = &local_68;
  local_48._8_8_ = (pointer)0x1;
  ::std::allocator<cfd::core::Txid>::allocator(local_7d);
  __l._M_len = local_48._8_8_;
  __l._M_array = (iterator)local_48._0_8_;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector
            ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)(local_48 + 0x10),__l,
             local_7d);
  GetTxOutProof(__return_storage_ptr__,this,
                (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)(local_48 + 0x10));
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector
            ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)(local_48 + 0x10));
  ::std::allocator<cfd::core::Txid>::~allocator(local_7d);
  local_a8 = (Txid *)local_48;
  do {
    local_a8 = local_a8 + -1;
    Txid::~Txid((Txid *)0x757082);
  } while (local_a8 != &local_68);
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const Txid& txid) const {
  return GetTxOutProof(std::vector<Txid>{txid});
}